

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackRecordVariableSelectionCase::iterate
          (FeedbackRecordVariableSelectionCase *this)

{
  ulong uVar1;
  ostringstream *poVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  float *pfVar8;
  ulong uVar9;
  TestError *pTVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  VertexArray vao;
  Vec4 feedbackValues [3];
  Vector<bool,_4> res;
  ObjectWrapper local_200;
  Vector<float,_4> local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar5);
  iVar5 = (**(code **)(lVar11 + 0x780))((this->m_program->m_program).m_program,"a_position");
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_200,(Functions *)CONCAT44(extraout_var_00,iVar6),traits);
  if (iVar5 == -1) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"a_position attribute location was -1","");
    tcu::TestError::TestError(pTVar10,(string *)local_1b0);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Rendering a patch of size 3.",0x1c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar11 + 0x1a00))(0,0,1,1);
  (**(code **)(lVar11 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar11 + 0x188))(0x4000);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb5f);
  (**(code **)(lVar11 + 0xd8))(local_200.m_object);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"bindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb62);
  (**(code **)(lVar11 + 0x1858))(0,0,0,0x3f800000,iVar5);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"vertexAttrib4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb65);
  (**(code **)(lVar11 + 0x1680))((this->m_program->m_program).m_program);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb68);
  (**(code **)(lVar11 + 0xfd8))(0x8e72,3);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb6b);
  (**(code **)(lVar11 + 0x48))(0x8c8e,0,this->m_xfbBuf);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"bind xfb buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb6e);
  (**(code **)(lVar11 + 0x30))(4);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"beginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb71);
  (**(code **)(lVar11 + 0x538))(0xe,0,3);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb74);
  (**(code **)(lVar11 + 0x638))();
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"beginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb77);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,
             "Verifying the value of tf_feedback using transform feedback, expecting (3.0, 3.0, 3.0, 3.0)."
             ,0x5c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  pfVar8 = (float *)(**(code **)(lVar11 + 0xd00))(0x8c8e,0,0x30,1);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"mapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb7f);
  if (pfVar8 == (float *)0x0) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"mapBufferRange returned null","");
    tcu::TestError::TestError(pTVar10,(string *)local_1b0);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1e8.m_data[0] = *pfVar8;
  local_1e8.m_data[1] = pfVar8[1];
  local_1e8.m_data[2] = pfVar8[2];
  local_1e8.m_data[3] = pfVar8[3];
  local_1d8 = *(undefined8 *)(pfVar8 + 4);
  uStack_1d0 = *(undefined8 *)(pfVar8 + 6);
  local_1c8 = pfVar8[8];
  fStack_1c4 = pfVar8[9];
  fStack_1c0 = pfVar8[10];
  fStack_1bc = pfVar8[0xb];
  cVar4 = (**(code **)(lVar11 + 0x1670))(0x8c8e);
  if (cVar4 != '\x01') {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"unmapBuffer did not return TRUE","");
    tcu::TestError::TestError(pTVar10,(string *)local_1b0);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  poVar2 = (ostringstream *)(local_1b0 + 8);
  lVar11 = 0;
  do {
    fVar12 = (&local_1e8)[lVar11].m_data[0] + -3.0;
    fVar13 = (&local_1e8)[lVar11].m_data[1] + -3.0;
    fVar14 = (&local_1e8)[lVar11].m_data[2] + -3.0;
    fVar15 = (&local_1e8)[lVar11].m_data[3] + -3.0;
    auVar16._0_8_ = CONCAT44(fVar13,fVar12) ^ 0x8000000080000000;
    auVar16._8_4_ = -fVar14;
    auVar16._12_4_ = -fVar15;
    auVar17._4_4_ = fVar13;
    auVar17._0_4_ = fVar12;
    auVar17._8_4_ = fVar14;
    auVar17._12_4_ = fVar15;
    auVar17 = maxps(auVar16,auVar17);
    auVar18._4_4_ = -(uint)(auVar17._4_4_ < 0.001);
    auVar18._0_4_ = -(uint)(auVar17._0_4_ < 0.001);
    auVar18._8_4_ = -(uint)(auVar17._8_4_ < 0.001);
    auVar18._12_4_ = -(uint)(auVar17._12_4_ < 0.001);
    auVar17 = packssdw(auVar18,auVar18);
    auVar17 = packsswb(auVar17,auVar17);
    local_1b0._0_4_ = SUB164(auVar17 & _DAT_00967bd0,0);
    if (SUB161(auVar17 & _DAT_00967bd0,0) == '\0') {
LAB_00573252:
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Feedback vertex ",0x10);
      std::ostream::operator<<(poVar2,(int)lVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,": expected (3.0, 3.0, 3.0, 3.0), got ",0x25);
      tcu::operator<<((ostream *)poVar2,&local_1e8 + lVar11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "got unexpected feedback results");
    }
    else {
      uVar9 = 0xffffffffffffffff;
      do {
        if (uVar9 == 2) goto LAB_005732e4;
        uVar1 = uVar9 + 1;
        lVar3 = uVar9 + 2;
        uVar9 = uVar1;
      } while (local_1b0[lVar3] != '\0');
      if (uVar1 < 3) goto LAB_00573252;
    }
LAB_005732e4:
    lVar11 = lVar11 + 1;
    if (lVar11 == 3) {
      glu::ObjectWrapper::~ObjectWrapper(&local_200);
      return STOP;
    }
  } while( true );
}

Assistant:

FeedbackRecordVariableSelectionCase::IterateResult FeedbackRecordVariableSelectionCase::iterate (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	const int				posLoc	= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const glu::VertexArray	vao		(m_context.getRenderContext());

	if (posLoc == -1)
		throw tcu::TestError("a_position attribute location was -1");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering a patch of size 3." << tcu::TestLog::EndMessage;

	// Render and feed back

	gl.viewport(0, 0, 1, 1);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	gl.bindVertexArray(*vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindVertexArray");

	gl.vertexAttrib4f(posLoc, 0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "vertexAttrib4f");

	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind xfb buf");

	gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	gl.drawArrays(GL_PATCHES, 0, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying the value of tf_feedback using transform feedback, expecting (3.0, 3.0, 3.0, 3.0)." << tcu::TestLog::EndMessage;

	// Read back result (one triangle)
	{
		tcu::Vec4	feedbackValues[3];
		const void* mapPtr				= gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, (int)sizeof(feedbackValues), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "mapBufferRange");

		if (mapPtr == DE_NULL)
			throw tcu::TestError("mapBufferRange returned null");

		deMemcpy(feedbackValues, mapPtr, sizeof(feedbackValues));

		if (gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER) != GL_TRUE)
			throw tcu::TestError("unmapBuffer did not return TRUE");

		for (int ndx = 0; ndx < 3; ++ndx)
		{
			if (!tcu::boolAll(tcu::lessThan(tcu::abs(feedbackValues[ndx] - tcu::Vec4(3.0f)), tcu::Vec4(0.001f))))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Feedback vertex " << ndx << ": expected (3.0, 3.0, 3.0, 3.0), got " << feedbackValues[ndx] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected feedback results");
			}
		}
	}

	return STOP;
}